

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gradient.h
# Opt level: O0

int __thiscall Gradient::addPoint(Gradient *this,GradientPoint *point)

{
  bool bVar1;
  int iVar2;
  pointer pGVar3;
  float *in_RSI;
  __normal_iterator<GradientPoint_*,_std::vector<GradientPoint,_std::allocator<GradientPoint>_>_>
  *in_RDI;
  iterator i;
  value_type *in_stack_00000058;
  vector<GradientPoint,_std::allocator<GradientPoint>_> *in_stack_00000060;
  const_iterator in_stack_00000068;
  uint7 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbf;
  __normal_iterator<GradientPoint_*,_std::vector<GradientPoint,_std::allocator<GradientPoint>_>_>
  *in_stack_ffffffffffffffc8;
  __normal_iterator<GradientPoint_*,_std::vector<GradientPoint,_std::allocator<GradientPoint>_>_>
  local_18;
  float *local_10;
  
  local_10 = in_RSI;
  local_18._M_current =
       (GradientPoint *)
       std::vector<GradientPoint,_std::allocator<GradientPoint>_>::begin
                 ((vector<GradientPoint,_std::allocator<GradientPoint>_> *)
                  CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
  while( true ) {
    std::vector<GradientPoint,_std::allocator<GradientPoint>_>::end
              ((vector<GradientPoint,_std::allocator<GradientPoint>_> *)
               CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
    bVar1 = __gnu_cxx::operator!=
                      (in_RDI,(__normal_iterator<GradientPoint_*,_std::vector<GradientPoint,_std::allocator<GradientPoint>_>_>
                               *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
    in_stack_ffffffffffffffbf = false;
    if (bVar1) {
      pGVar3 = __gnu_cxx::
               __normal_iterator<GradientPoint_*,_std::vector<GradientPoint,_std::allocator<GradientPoint>_>_>
               ::operator->(&local_18);
      in_stack_ffffffffffffffbf = pGVar3->units < *local_10;
    }
    if ((bool)in_stack_ffffffffffffffbf == false) break;
    __gnu_cxx::
    __normal_iterator<GradientPoint_*,_std::vector<GradientPoint,_std::allocator<GradientPoint>_>_>
    ::operator++(in_stack_ffffffffffffffc8,(int)((ulong)in_RDI >> 0x20));
  }
  __gnu_cxx::
  __normal_iterator<GradientPoint_const*,std::vector<GradientPoint,std::allocator<GradientPoint>>>::
  __normal_iterator<GradientPoint*>
            ((__normal_iterator<const_GradientPoint_*,_std::vector<GradientPoint,_std::allocator<GradientPoint>_>_>
              *)in_RDI,
             (__normal_iterator<GradientPoint_*,_std::vector<GradientPoint,_std::allocator<GradientPoint>_>_>
              *)(ulong)in_stack_ffffffffffffffb8);
  std::vector<GradientPoint,_std::allocator<GradientPoint>_>::insert
            (in_stack_00000060,in_stack_00000068,in_stack_00000058);
  iVar2 = size((Gradient *)0x239a4f);
  return iVar2;
}

Assistant:

int addPoint(const GradientPoint &point) {
    auto i = points.begin();
    while (i != points.end() && i->units < point.units) i++;
    points.insert(i, point);
    return size();
  }